

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _context.cpp
# Opt level: O3

uint16_t __thiscall r_exec::_Context::setTimestampResult(_Context *this,uint64_t t)

{
  uint16_t index;
  Overlay *pOVar1;
  Atom *pAVar2;
  uint uVar3;
  Atom local_2c [4];
  
  pOVar1 = this->overlay;
  index = this->index;
  r_code::Atom::ValuePointer((ushort)local_2c);
  Overlay::patch_code(pOVar1,index,local_2c);
  r_code::Atom::~Atom(local_2c);
  pOVar1 = this->overlay;
  std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::resize
            (&(pOVar1->values).m_vector,
             ((long)(pOVar1->values).m_vector.
                    super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pOVar1->values).m_vector.
                    super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) + 3);
  pOVar1 = this->overlay;
  uVar3 = ((uint)(*(int *)&(pOVar1->values).m_vector.
                           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                 *(int *)&(pOVar1->values).m_vector.
                          super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2) - 3;
  pAVar2 = r_code::vector<r_code::Atom>::operator[](&pOVar1->values,(ulong)(uVar3 & 0xffff));
  r_code::Utils::SetTimestamp(pAVar2,t);
  return (uint16_t)uVar3;
}

Assistant:

uint16_t _Context::setTimestampResult(uint64_t t) const   // patch code with a VALUE_PTR
{
    overlay->patch_code(index, Atom::ValuePointer(overlay->values.size()));
    overlay->values.as_std()->resize(overlay->values.size() + 3);
    uint16_t value_index = overlay->values.size() - 3;
    Utils::SetTimestamp(&overlay->values[value_index], t);
    return value_index;
}